

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O0

bool __thiscall xray_re::xr_level_ai::load(xr_level_ai *this,char *key,char *name)

{
  bool bVar1;
  xr_reader *local_38;
  xr_reader *r;
  xr_file_system *fs;
  char *name_local;
  char *key_local;
  xr_level_ai *this_local;
  
  fs = (xr_file_system *)name;
  name_local = key;
  key_local = (char *)this;
  r = (xr_reader *)xr_file_system::instance();
  local_38 = xr_file_system::r_open((xr_file_system *)r,name_local,(char *)fs);
  if (local_38 == (xr_reader *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    load(this,local_38);
    bVar1 = xr_reader::eof(local_38);
    if (!bVar1) {
      __assert_fail("r->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_ai.cxx"
                    ,0x79,"bool xray_re::xr_level_ai::load(const char *, const char *)");
    }
    xr_file_system::r_close((xr_file_system *)r,&local_38);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool xr_level_ai::load(const char* key, const char* name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(key, name);
	if (r == 0)
		return false;
	load(*r);
	assert(r->eof());
	fs.r_close(r);
	return true;
}